

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_reporter_xml.hpp
# Opt level: O3

void __thiscall Catch::XmlReporter::testCaseEnded(XmlReporter *this,TestCaseStats *testCaseStats)

{
  XmlWriter *this_00;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  int iVar2;
  ScopedElement e;
  timeval t;
  ScopedElement local_60;
  string local_58;
  double local_38;
  timeval local_30;
  
  Option<Catch::TestCaseInfo>::reset
            (&(this->super_StreamingReporterBase).currentTestCaseInfo.
              super_Option<Catch::TestCaseInfo>);
  (this->super_StreamingReporterBase).currentTestCaseInfo.used = false;
  paVar1 = &local_58.field_2;
  local_58._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"OverallResult","");
  this_00 = &this->m_xml;
  local_60.m_writer = this_00;
  XmlWriter::startElement(this_00,&local_58);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != paVar1) {
    operator_delete(local_58._M_dataplus._M_p);
  }
  local_58._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"success","");
  XmlWriter::writeAttribute
            (local_60.m_writer,&local_58,(testCaseStats->totals).assertions.failed == 0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != paVar1) {
    operator_delete(local_58._M_dataplus._M_p);
  }
  iVar2 = (*(((this->super_StreamingReporterBase).m_config.m_p)->super_IShared).super_NonCopyable.
            _vptr_NonCopyable[0xc])();
  if (iVar2 == 1) {
    local_58._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"durationInSeconds","");
    gettimeofday(&local_30,(__timezone_ptr_t)0x0);
    local_38 = (double)(uint)(((int)local_30.tv_sec * 1000000 + (int)local_30.tv_usec) -
                             (int)(this->m_testCaseTimer).m_ticks) / 1000000.0;
    XmlWriter::writeAttribute<double>(local_60.m_writer,&local_58,&local_38);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58._M_dataplus._M_p != paVar1) {
      operator_delete(local_58._M_dataplus._M_p);
    }
  }
  XmlWriter::endElement(this_00);
  XmlWriter::ScopedElement::~ScopedElement(&local_60);
  return;
}

Assistant:

virtual void testCaseEnded( TestCaseStats const& testCaseStats ) {
            StreamingReporterBase::testCaseEnded( testCaseStats );
            XmlWriter::ScopedElement e = m_xml.scopedElement( "OverallResult" );
            e.writeAttribute( "success", testCaseStats.totals.assertions.allOk() );

            if ( m_config->showDurations() == ShowDurations::Always )
                e.writeAttribute( "durationInSeconds", m_testCaseTimer.getElapsedSeconds() );

            m_xml.endElement();
        }